

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

vec<4,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  CanonicalDataSource CVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  element_type *this_00;
  int64_t iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_RDI;
  vec<4,_unsigned_int,_(glm::qualifier)0> vVar7;
  vec<4,_unsigned_int,_(glm::qualifier)0> val;
  size_t in_stack_fffffffffffffda8;
  AttributeBuffer *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string local_1d0 [32];
  string local_1b0 [32];
  ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *in_stack_fffffffffffffe70;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [48];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  value_type local_10;
  undefined1 auVar8 [12];
  
  local_20 = in_RSI;
  bVar2 = deviceBufferTypeIsTexture(in_RDI);
  if (bVar2) {
    ensureHostBufferPopulated(in_stack_fffffffffffffe70);
  }
  CVar3 = currentCanonicalDataSource(in_stack_fffffffffffffe08);
  pbVar1 = local_20;
  if (CVar3 == HostData) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size(in_RDI->data);
    if (pbVar4 <= pbVar1) {
      std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
    }
    pvVar5 = std::
             vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             ::operator[](in_RDI->data,(size_type)local_20);
    local_10 = *pvVar5;
  }
  else if (CVar3 == NeedsCompute) {
    std::function<void_()>::operator()((function<void_()> *)in_stack_fffffffffffffdb0);
    pbVar1 = local_20;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size(in_RDI->data);
    if (pbVar4 <= pbVar1) {
      std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
    }
    pvVar5 = std::
             vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             ::operator[](in_RDI->data,(size_type)local_20);
    local_10 = *pvVar5;
  }
  else if (CVar3 == RenderBuffer) {
    this_00 = std::
              __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x42ff1b);
    iVar6 = AttributeBuffer::getDataSize(this_00);
    if (iVar6 <= (long)local_20) {
      in_stack_fffffffffffffdb0 = (AttributeBuffer *)&stack0xfffffffffffffe10;
      std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::operator+(local_20,(char *)in_stack_fffffffffffffdb0);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffde0));
      std::operator+(local_20,(char *)in_stack_fffffffffffffdb0);
      exception(in_stack_fffffffffffffe10);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    }
    std::
    __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffdb0);
    local_10 = getAttributeBufferData<glm::vec<4,unsigned_int,(glm::qualifier)0>>
                         (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  }
  else {
    memset(&local_10,0,0x10);
  }
  vVar7.field_0 = local_10.field_0;
  auVar8._4_4_ = local_10.field_1;
  vVar7.field_2 = local_10.field_2;
  vVar7.field_3 = local_10.field_3;
  return vVar7;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}